

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_logger.cpp
# Opt level: O0

void __thiscall cppnet::BaseLogger::FreeLog(BaseLogger *this,Log *log)

{
  size_t sVar1;
  element_type *peVar2;
  void *local_20;
  void *del;
  Log *log_local;
  BaseLogger *this_local;
  
  del = log;
  log_local = (Log *)this;
  sVar1 = ThreadSafeQueue<cppnet::Log_*>::Size(&this->_cache_queue);
  if (this->_cache_size < sVar1) {
    local_20 = del;
    peVar2 = std::__shared_ptr_access<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->_allocter);
    (*peVar2->_vptr_Alloter[5])(peVar2,&local_20,0);
  }
  else {
    *(uint *)((long)del + 8) = (uint)this->_block_size;
    ThreadSafeQueue<cppnet::Log_*>::Push(&this->_cache_queue,(Log **)&del);
  }
  return;
}

Assistant:

void BaseLogger::FreeLog(Log* log) {
    if (_cache_queue.Size() > _cache_size) {
        void* del = (void*)log;
        _allocter->Free(del);

    } else {
        log->_len = _block_size;
        _cache_queue.Push(log);
    }
}